

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

void __thiscall toml::internal::Parser::~Parser(Parser *this)

{
  std::__cxx11::string::~string((string *)&this->errorReason_);
  std::__cxx11::string::~string((string *)&(this->token_).str_value_);
  return;
}

Assistant:

explicit Parser(std::istream& is) : lexer_(is), token_(TokenType::ERROR_TOKEN)
    {
        if (!lexer_.skipUTF8BOM()) {
            token_ = Token(TokenType::ERROR_TOKEN, std::string("Invalid UTF8 BOM"));
        } else {
            nextKey();
        }
    }